

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal.cpp
# Opt level: O2

BOOL PALInitLock(void)

{
  CPalThread *pThread;
  
  if (init_critsec != (PCRITICAL_SECTION)0x0) {
    if (g_fThreadDataAvailable == '\x01') {
      pThread = CorUnix::InternalGetCurrentThread();
    }
    else {
      pThread = (CPalThread *)0x0;
    }
    CorUnix::InternalEnterCriticalSection(pThread,init_critsec);
    return 1;
  }
  return 0;
}

Assistant:

BOOL PALInitLock(void)
{
    if(!init_critsec)
    {
        return FALSE;
    }

    CPalThread * pThread =
        (PALIsThreadDataInitialized() ? InternalGetCurrentThread() : NULL);

    InternalEnterCriticalSection(pThread, init_critsec);
    return TRUE;
}